

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O0

bool btPolyhedralContactClipping::findSeparatingAxis
               (btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,btTransform *transA,
               btTransform *transB,btVector3 *sep,Result *resultOut)

{
  btScalar abVar1 [4];
  btScalar abVar2 [4];
  bool bVar3;
  int iVar4;
  btFace *pbVar5;
  btFace *pbVar6;
  btFace *pbVar7;
  btVector3 *pbVar8;
  btTransform *in_RCX;
  btTransform *in_RDX;
  long in_RSI;
  long in_RDI;
  btVector3 *in_R8;
  long *in_R9;
  btScalar bVar9;
  btScalar bVar10;
  btVector3 bVar11;
  btScalar distance;
  btVector3 ptOnB;
  btScalar nl;
  btScalar nlSqrt;
  btScalar hlenA;
  btScalar hlenB;
  btVector3 dirB;
  btVector3 dirA;
  btVector3 translation;
  btScalar tB;
  btScalar tA;
  btVector3 offsetB;
  btVector3 offsetA;
  btVector3 ptsVector;
  btVector3 wB_2;
  btVector3 wA_2;
  btScalar dist;
  btVector3 Cross;
  btVector3 WorldEdge1;
  btVector3 edge1;
  int e1;
  btVector3 WorldEdge0;
  btVector3 edge0;
  int e0;
  int curEdgeEdge;
  btVector3 witnessPointB;
  btVector3 witnessPointA;
  btVector3 worldEdgeB;
  btVector3 worldEdgeA;
  int edgeB;
  int edgeA;
  btVector3 edgeBend;
  btVector3 edgeBstart;
  btVector3 edgeAend;
  btVector3 edgeAstart;
  btVector3 wB_1;
  btVector3 wA_1;
  btScalar d_1;
  btVector3 WorldNormal;
  btVector3 Normal_1;
  int i_1;
  int numFacesB;
  btVector3 wB;
  btVector3 wA;
  btScalar d;
  btVector3 faceANormalWS;
  btVector3 Normal;
  int i;
  int numFacesA;
  int curPlaneTests;
  btScalar dmin;
  btVector3 DeltaC2;
  btVector3 c1;
  btVector3 c0;
  btVector3 *in_stack_fffffffffffffcc8;
  btTransform *in_stack_fffffffffffffcd0;
  btVector3 *in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffce0;
  undefined4 in_stack_fffffffffffffce4;
  int iVar12;
  btVector3 *in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  undefined4 in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd2c;
  undefined1 in_stack_fffffffffffffd30 [16];
  btScalar in_stack_fffffffffffffd40;
  btScalar in_stack_fffffffffffffd44;
  undefined4 in_stack_fffffffffffffd48;
  undefined4 in_stack_fffffffffffffd4c;
  btVector3 *in_stack_fffffffffffffd60;
  btVector3 *in_stack_fffffffffffffd68;
  btConvexPolyhedron *in_stack_fffffffffffffd70;
  btVector3 in_stack_fffffffffffffd78;
  btVector3 *in_stack_fffffffffffffd88;
  btTransform *in_stack_fffffffffffffd90;
  btTransform *in_stack_fffffffffffffd98;
  btVector3 local_260;
  btVector3 local_250;
  undefined1 local_240 [56];
  btScalar local_208 [4];
  undefined8 local_1f8;
  undefined8 uStack_1f0;
  int local_1dc;
  btScalar local_1d8 [4];
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  int local_1b8;
  int local_1b4;
  btScalar local_1b0;
  btScalar local_1ac;
  btScalar local_1a8;
  btVector3 local_1a4;
  btScalar local_194;
  btScalar local_190;
  btScalar local_18c;
  btVector3 local_188;
  btVector3 *local_178;
  btScalar local_170 [2];
  btVector3 local_168;
  int local_158;
  int local_154;
  btVector3 local_150;
  btVector3 local_140;
  btVector3 local_130;
  btVector3 local_120;
  undefined1 local_110 [72];
  int local_c8;
  int local_c4;
  undefined1 local_c0 [72];
  int local_78;
  int local_74;
  int local_70;
  float local_6c;
  btVector3 local_68;
  btScalar local_58 [4];
  btScalar local_48 [4];
  long *local_38;
  btVector3 *local_30;
  btTransform *local_28;
  btTransform *local_20;
  long local_18;
  long local_10;
  
  gActualSATPairTests = gActualSATPairTests + 1;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_48 = (btScalar  [4])
             btTransform::operator*(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_58 = (btScalar  [4])
             btTransform::operator*(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
  local_68 = operator-((btVector3 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                       in_stack_fffffffffffffcd8);
  local_6c = 3.4028235e+38;
  local_70 = 0;
  local_74 = btAlignedObjectArray<btFace>::size((btAlignedObjectArray<btFace> *)(local_10 + 0x28));
  for (local_78 = 0; local_78 < local_74; local_78 = local_78 + 1) {
    pbVar5 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_10 + 0x28),local_78);
    pbVar6 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_10 + 0x28),local_78);
    pbVar7 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_10 + 0x28),local_78);
    in_stack_fffffffffffffd10 = (btVector3 *)(local_c0 + 0x38);
    btVector3::btVector3
              (in_stack_fffffffffffffd10,pbVar5->m_plane,pbVar6->m_plane + 1,pbVar7->m_plane + 2);
    btTransform::getBasis(local_20);
    local_c0._40_16_ =
         (undefined1  [16])
         ::operator*((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8);
    bVar9 = btVector3::dot(&local_68,(btVector3 *)(local_c0 + 0x28));
    if (bVar9 < 0.0) {
      local_c0._36_4_ = -1.0;
      btVector3::operator*=((btVector3 *)(local_c0 + 0x28),(btScalar *)(local_c0 + 0x24));
    }
    local_70 = local_70 + 1;
    gExpectedNbTests = gExpectedNbTests + 1;
    if (((gUseInternalObject & 1U) == 0) ||
       (bVar3 = TestInternalObjects(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                    in_stack_fffffffffffffd88,
                                    in_stack_fffffffffffffd78.m_floats._8_8_,
                                    in_stack_fffffffffffffd78.m_floats._0_8_,
                                    in_stack_fffffffffffffd70,
                                    (btScalar)((ulong)in_stack_fffffffffffffd68 >> 0x20)), bVar3)) {
      gActualNbTests = gActualNbTests + 1;
      btVector3::btVector3((btVector3 *)(local_c0 + 0x10));
      btVector3::btVector3((btVector3 *)local_c0);
      in_stack_fffffffffffffcc8 = (btVector3 *)(local_c0 + 0x10);
      in_stack_fffffffffffffcd0 = (btTransform *)local_c0;
      bVar3 = TestSepAxis((btConvexPolyhedron *)
                          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                          (btConvexPolyhedron *)
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                          in_stack_fffffffffffffd30._8_8_,in_stack_fffffffffffffd30._0_8_,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                          ,(btScalar *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68);
      if (!bVar3) {
        return false;
      }
      if ((float)local_c0._32_4_ < local_6c) {
        local_6c = (float)local_c0._32_4_;
        *(undefined8 *)local_30->m_floats = local_c0._40_8_;
        *(undefined8 *)(local_30->m_floats + 2) = local_c0._48_8_;
      }
    }
  }
  local_c4 = btAlignedObjectArray<btFace>::size((btAlignedObjectArray<btFace> *)(local_18 + 0x28));
  local_c8 = 0;
  do {
    if (local_c4 <= local_c8) {
      btVector3::btVector3(&local_120);
      btVector3::btVector3(&local_130);
      btVector3::btVector3(&local_140);
      btVector3::btVector3(&local_150);
      local_154 = -1;
      local_158 = -1;
      btVector3::btVector3(&local_168);
      btVector3::btVector3((btVector3 *)&local_178);
      local_18c = 0.0;
      local_190 = 0.0;
      local_194 = 0.0;
      btVector3::btVector3(&local_188,&local_18c,&local_190,&local_194);
      local_1a8 = 0.0;
      local_1ac = 0.0;
      local_1b0 = 0.0;
      btVector3::btVector3(&local_1a4,&local_1a8,&local_1ac,&local_1b0);
      local_1b4 = 0;
      local_1b8 = 0;
      do {
        iVar12 = local_1b8;
        iVar4 = btAlignedObjectArray<btVector3>::size
                          ((btAlignedObjectArray<btVector3> *)(local_10 + 0x48));
        if (iVar4 <= iVar12) {
          if ((-1 < local_154) && (-1 < local_158)) {
            btVector3::btVector3(&local_250);
            btVector3::btVector3(&local_260);
            btVector3::btVector3((btVector3 *)&stack0xfffffffffffffd90);
            operator-((btVector3 *)CONCAT44(iVar12,in_stack_fffffffffffffce0),
                      in_stack_fffffffffffffcd8);
            in_stack_fffffffffffffcd0 = (btTransform *)&stack0xfffffffffffffd58;
            btSegmentsClosestPoints
                      ((btVector3 *)CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                       in_stack_fffffffffffffd30._8_8_,in_stack_fffffffffffffd30._0_8_,
                       (btScalar *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                       (btScalar *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                       (btVector3 *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
                       (btVector3 *)0x7149f2ca7149f2ca,
                       (btScalar)((ulong)in_stack_fffffffffffffd10 >> 0x20),local_178,
                       SUB84(in_stack_fffffffffffffd10,0));
            bVar9 = btVector3::length2((btVector3 *)0x1f2c3a);
            if (1.1920929e-07 < bVar9) {
              bVar9 = btSqrt(0.0);
              btVector3::operator*=(&local_250,(btScalar *)&stack0xfffffffffffffd44);
              bVar10 = btVector3::dot(&local_250,&local_68);
              if (bVar10 < 0.0) {
                btVector3::operator*=(&local_250,(btScalar *)&stack0xfffffffffffffd40);
              }
              operator+((btVector3 *)CONCAT44(iVar12,in_stack_fffffffffffffce0),
                        in_stack_fffffffffffffcd8);
              (**(code **)(*local_38 + 0x20))(-bVar9,local_38,&local_250,&stack0xfffffffffffffd30);
            }
          }
          bVar9 = btVector3::dot(&local_68,local_30);
          if (bVar9 < 0.0) {
            bVar11 = operator-((btVector3 *)in_stack_fffffffffffffcd0);
            *(long *)local_30->m_floats = bVar11.m_floats._0_8_;
            *(long *)(local_30->m_floats + 2) = bVar11.m_floats._8_8_;
          }
          return true;
        }
        pbVar8 = btAlignedObjectArray<btVector3>::operator[]
                           ((btAlignedObjectArray<btVector3> *)(local_10 + 0x48),local_1b8);
        local_1c8 = *(undefined8 *)pbVar8->m_floats;
        uStack_1c0 = *(undefined8 *)(pbVar8->m_floats + 2);
        btTransform::getBasis(local_20);
        local_1d8 = (btScalar  [4])
                    ::operator*((btMatrix3x3 *)CONCAT44(iVar12,in_stack_fffffffffffffce0),
                                in_stack_fffffffffffffcd8);
        local_1dc = 0;
        while (in_stack_fffffffffffffce0 = local_1dc,
              iVar4 = btAlignedObjectArray<btVector3>::size
                                ((btAlignedObjectArray<btVector3> *)(local_18 + 0x48)),
              in_stack_fffffffffffffce0 < iVar4) {
          pbVar8 = btAlignedObjectArray<btVector3>::operator[]
                             ((btAlignedObjectArray<btVector3> *)(local_18 + 0x48),local_1dc);
          local_1f8 = *(undefined8 *)pbVar8->m_floats;
          uStack_1f0 = *(undefined8 *)(pbVar8->m_floats + 2);
          btTransform::getBasis(local_28);
          local_208 = (btScalar  [4])
                      ::operator*((btMatrix3x3 *)CONCAT44(iVar12,in_stack_fffffffffffffce0),
                                  in_stack_fffffffffffffcd8);
          local_240._40_16_ =
               (undefined1  [16])
               btVector3::cross((btVector3 *)CONCAT44(iVar12,in_stack_fffffffffffffce0),
                                in_stack_fffffffffffffcd8);
          local_1b4 = local_1b4 + 1;
          bVar3 = IsAlmostZero(in_stack_fffffffffffffcc8);
          if (!bVar3) {
            pbVar8 = btVector3::normalize((btVector3 *)in_stack_fffffffffffffcd0);
            local_240._40_16_ = *(undefined1 (*) [16])pbVar8->m_floats;
            bVar9 = btVector3::dot(&local_68,(btVector3 *)(local_240 + 0x28));
            if (bVar9 < 0.0) {
              local_240._36_4_ = -1.0;
              btVector3::operator*=((btVector3 *)(local_240 + 0x28),(btScalar *)(local_240 + 0x24));
            }
            gExpectedNbTests = gExpectedNbTests + 1;
            if (((gUseInternalObject & 1U) == 0) ||
               (bVar3 = TestInternalObjects(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                            in_stack_fffffffffffffd88,
                                            in_stack_fffffffffffffd78.m_floats._8_8_,
                                            in_stack_fffffffffffffd78.m_floats._0_8_,
                                            in_stack_fffffffffffffd70,
                                            (btScalar)((ulong)in_stack_fffffffffffffd68 >> 0x20)),
               bVar3)) {
              gActualNbTests = gActualNbTests + 1;
              btVector3::btVector3((btVector3 *)(local_240 + 0x10));
              btVector3::btVector3((btVector3 *)local_240);
              in_stack_fffffffffffffcc8 = (btVector3 *)(local_240 + 0x10);
              in_stack_fffffffffffffcd0 = (btTransform *)local_240;
              bVar3 = TestSepAxis((btConvexPolyhedron *)
                                  CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                                  (btConvexPolyhedron *)
                                  CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                                  in_stack_fffffffffffffd30._8_8_,in_stack_fffffffffffffd30._0_8_,
                                  (btVector3 *)
                                  CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28),
                                  (btScalar *)
                                  CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                                  in_stack_fffffffffffffd60,in_stack_fffffffffffffd68);
              abVar2 = local_1d8;
              abVar1 = local_208;
              if (!bVar3) {
                return false;
              }
              local_208 = abVar1;
              local_1d8 = abVar2;
              if ((float)local_240._32_4_ < local_6c) {
                local_6c = (float)local_240._32_4_;
                *(undefined8 *)local_30->m_floats = local_240._40_8_;
                *(undefined8 *)(local_30->m_floats + 2) = local_240._48_8_;
                local_154 = local_1b8;
                local_158 = local_1dc;
                local_168.m_floats[0] = local_1d8[0];
                local_168.m_floats[1] = local_1d8[1];
                local_1d8._8_8_ = abVar2._8_8_;
                local_168.m_floats[2] = local_1d8[2];
                local_168.m_floats[3] = local_1d8[3];
                local_178 = (btVector3 *)local_208._0_8_;
                local_170[0] = local_208[2];
                local_170[1] = local_208[3];
                local_188.m_floats[0] = (btScalar)local_240._16_4_;
                local_188.m_floats[1] = (btScalar)local_240._20_4_;
                local_188.m_floats[2] = (btScalar)local_240._24_4_;
                local_188.m_floats[3] = (btScalar)local_240._28_4_;
                local_1a4.m_floats[0] = (btScalar)local_240._0_4_;
                local_1a4.m_floats[1] = (btScalar)local_240._4_4_;
                local_1a4.m_floats[2] = (btScalar)local_240._8_4_;
                local_1a4.m_floats[3] = (btScalar)local_240._12_4_;
              }
            }
          }
          local_1dc = local_1dc + 1;
        }
        local_1b8 = local_1b8 + 1;
      } while( true );
    }
    pbVar5 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_18 + 0x28),local_c8);
    pbVar6 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_18 + 0x28),local_c8);
    pbVar7 = btAlignedObjectArray<btFace>::operator[]
                       ((btAlignedObjectArray<btFace> *)(local_18 + 0x28),local_c8);
    btVector3::btVector3
              ((btVector3 *)(local_110 + 0x38),pbVar5->m_plane,pbVar6->m_plane + 1,
               pbVar7->m_plane + 2);
    btTransform::getBasis(local_28);
    local_110._40_16_ =
         (undefined1  [16])
         ::operator*((btMatrix3x3 *)CONCAT44(in_stack_fffffffffffffce4,in_stack_fffffffffffffce0),
                     in_stack_fffffffffffffcd8);
    bVar9 = btVector3::dot(&local_68,(btVector3 *)(local_110 + 0x28));
    if (bVar9 < 0.0) {
      local_110._36_4_ = -1.0;
      btVector3::operator*=((btVector3 *)(local_110 + 0x28),(btScalar *)(local_110 + 0x24));
    }
    local_70 = local_70 + 1;
    gExpectedNbTests = gExpectedNbTests + 1;
    if (((gUseInternalObject & 1U) == 0) ||
       (bVar3 = TestInternalObjects(in_stack_fffffffffffffd98,in_stack_fffffffffffffd90,
                                    in_stack_fffffffffffffd88,
                                    in_stack_fffffffffffffd78.m_floats._8_8_,
                                    in_stack_fffffffffffffd78.m_floats._0_8_,
                                    in_stack_fffffffffffffd70,
                                    (btScalar)((ulong)in_stack_fffffffffffffd68 >> 0x20)), bVar3)) {
      gActualNbTests = gActualNbTests + 1;
      btVector3::btVector3((btVector3 *)(local_110 + 0x10));
      btVector3::btVector3((btVector3 *)local_110);
      in_stack_fffffffffffffcc8 = (btVector3 *)(local_110 + 0x10);
      in_stack_fffffffffffffcd0 = (btTransform *)local_110;
      bVar3 = TestSepAxis((btConvexPolyhedron *)
                          CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                          (btConvexPolyhedron *)
                          CONCAT44(in_stack_fffffffffffffd44,in_stack_fffffffffffffd40),
                          in_stack_fffffffffffffd30._8_8_,in_stack_fffffffffffffd30._0_8_,
                          (btVector3 *)CONCAT44(in_stack_fffffffffffffd2c,in_stack_fffffffffffffd28)
                          ,(btScalar *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                          ,in_stack_fffffffffffffd60,in_stack_fffffffffffffd68);
      if (!bVar3) {
        return false;
      }
      if ((float)local_110._32_4_ < local_6c) {
        local_6c = (float)local_110._32_4_;
        *(undefined8 *)local_30->m_floats = local_110._40_8_;
        *(undefined8 *)(local_30->m_floats + 2) = local_110._48_8_;
      }
    }
    local_c8 = local_c8 + 1;
  } while( true );
}

Assistant:

bool btPolyhedralContactClipping::findSeparatingAxis(	const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, btVector3& sep, btDiscreteCollisionDetectorInterface::Result& resultOut)
{
	gActualSATPairTests++;

//#ifdef TEST_INTERNAL_OBJECTS
	const btVector3 c0 = transA * hullA.m_localCenter;
	const btVector3 c1 = transB * hullB.m_localCenter;
	const btVector3 DeltaC2 = c0 - c1;
//#endif

	btScalar dmin = FLT_MAX;
	int curPlaneTests=0;

	int numFacesA = hullA.m_faces.size();
	// Test normals from hullA
	for(int i=0;i<numFacesA;i++)
	{
		const btVector3 Normal(hullA.m_faces[i].m_plane[0], hullA.m_faces[i].m_plane[1], hullA.m_faces[i].m_plane[2]);
		btVector3 faceANormalWS = transA.getBasis() * Normal;
		if (DeltaC2.dot(faceANormalWS)<0)
			faceANormalWS*=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB, DeltaC2, faceANormalWS, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis( hullA, hullB, transA,transB, faceANormalWS, d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = faceANormalWS;
		}
	}

	int numFacesB = hullB.m_faces.size();
	// Test normals from hullB
	for(int i=0;i<numFacesB;i++)
	{
		const btVector3 Normal(hullB.m_faces[i].m_plane[0], hullB.m_faces[i].m_plane[1], hullB.m_faces[i].m_plane[2]);
		btVector3 WorldNormal = transB.getBasis() * Normal;
		if (DeltaC2.dot(WorldNormal)<0)
			WorldNormal *=-1.f;

		curPlaneTests++;
#ifdef TEST_INTERNAL_OBJECTS
		gExpectedNbTests++;
		if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, WorldNormal, hullA, hullB, dmin))
			continue;
		gActualNbTests++;
#endif

		btScalar d;
		btVector3 wA,wB;
		if(!TestSepAxis(hullA, hullB,transA,transB, WorldNormal,d,wA,wB))
			return false;

		if(d<dmin)
		{
			dmin = d;
			sep = WorldNormal;
		}
	}

	btVector3 edgeAstart,edgeAend,edgeBstart,edgeBend;
	int edgeA=-1;
	int edgeB=-1;
	btVector3 worldEdgeA;
	btVector3 worldEdgeB;
	btVector3 witnessPointA(0,0,0),witnessPointB(0,0,0);
	

	int curEdgeEdge = 0;
	// Test edges
	for(int e0=0;e0<hullA.m_uniqueEdges.size();e0++)
	{
		const btVector3 edge0 = hullA.m_uniqueEdges[e0];
		const btVector3 WorldEdge0 = transA.getBasis() * edge0;
		for(int e1=0;e1<hullB.m_uniqueEdges.size();e1++)
		{
			const btVector3 edge1 = hullB.m_uniqueEdges[e1];
			const btVector3 WorldEdge1 = transB.getBasis() * edge1;

			btVector3 Cross = WorldEdge0.cross(WorldEdge1);
			curEdgeEdge++;
			if(!IsAlmostZero(Cross))
			{
				Cross = Cross.normalize();
				if (DeltaC2.dot(Cross)<0)
					Cross *= -1.f;


#ifdef TEST_INTERNAL_OBJECTS
				gExpectedNbTests++;
				if(gUseInternalObject && !TestInternalObjects(transA,transB,DeltaC2, Cross, hullA, hullB, dmin))
					continue;
				gActualNbTests++;
#endif

				btScalar dist;
				btVector3 wA,wB;
				if(!TestSepAxis( hullA, hullB, transA,transB, Cross, dist,wA,wB))
					return false;

				if(dist<dmin)
				{
					dmin = dist;
					sep = Cross;
					edgeA=e0;
					edgeB=e1;
					worldEdgeA = WorldEdge0;
					worldEdgeB = WorldEdge1;
					witnessPointA=wA;
					witnessPointB=wB;
				}
			}
		}

	}

	if (edgeA>=0&&edgeB>=0)
	{
//		printf("edge-edge\n");
		//add an edge-edge contact

		btVector3 ptsVector;
		btVector3 offsetA;
		btVector3 offsetB;
		btScalar tA;
		btScalar tB;

		btVector3 translation = witnessPointB-witnessPointA;

		btVector3 dirA = worldEdgeA;
		btVector3 dirB = worldEdgeB;
		
		btScalar hlenB = 1e30f;
		btScalar hlenA = 1e30f;

		btSegmentsClosestPoints(ptsVector,offsetA,offsetB,tA,tB,
			translation,
			dirA, hlenA,
			dirB,hlenB);

		btScalar nlSqrt = ptsVector.length2();
		if (nlSqrt>SIMD_EPSILON)
		{
			btScalar nl = btSqrt(nlSqrt);
			ptsVector *= 1.f/nl;
			if (ptsVector.dot(DeltaC2)<0.f)
			{
				ptsVector*=-1.f;
			}
			btVector3 ptOnB = witnessPointB + offsetB;
			btScalar distance = nl;
			resultOut.addContactPoint(ptsVector, ptOnB,-distance);
		}

	}


	if((DeltaC2.dot(sep))<0.0f)
		sep = -sep;

	return true;
}